

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpCompressionState<float>::AlpCompressionState
          (AlpCompressionState<float> *this,ColumnDataCheckpointData *checkpoint_data,
          AlpAnalyzeState<float> *analyze_state)

{
  CompressionFunction *pCVar1;
  RowGroup *this_00;
  long in_RDX;
  _func_int **in_RSI;
  CompressionState *in_RDI;
  idx_t in_stack_00000098;
  AlpCompressionState<float> *in_stack_000000a0;
  vector<duckdb::alp::AlpCombination,_true> *in_stack_ffffffffffffff98;
  AlpCompressionState<float,_false> *in_stack_ffffffffffffffa0;
  BufferHandle *this_01;
  CompressionInfo *pCVar2;
  ColumnDataCheckpointData *in_stack_ffffffffffffffd0;
  
  CompressionState::CompressionState(in_RDI,(CompressionInfo *)(in_RDX + 8));
  in_RDI->_vptr_CompressionState = (_func_int **)&PTR__AlpCompressionState_0350ed80;
  in_RDI[1]._vptr_CompressionState = in_RSI;
  pCVar2 = &in_RDI[1].info;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction
                     (in_stack_ffffffffffffffd0,(CompressionType)((ulong)pCVar2 >> 0x38));
  pCVar2->block_manager = (BlockManager *)pCVar1;
  this_01 = (BufferHandle *)(in_RDI + 2);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0x9f85d6);
  BufferHandle::BufferHandle(this_01);
  in_RDI[4]._vptr_CompressionState = (_func_int **)0x0;
  in_RDI[4].info.block_manager = (BlockManager *)0x0;
  in_RDI[5]._vptr_CompressionState = (_func_int **)0x0;
  in_RDI[5].info.block_manager = (BlockManager *)0x0;
  *(undefined4 *)&in_RDI[7]._vptr_CompressionState = 4;
  alp::AlpCompressionState<float,_false>::AlpCompressionState(in_stack_ffffffffffffffa0);
  this_00 = ColumnDataCheckpointData::GetRowGroup((ColumnDataCheckpointData *)0x9f8634);
  CreateEmptySegment(in_stack_000000a0,in_stack_00000098);
  vector<duckdb::alp::AlpCombination,_true>::operator=
            ((vector<duckdb::alp::AlpCombination,_true> *)this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

AlpCompressionState(ColumnDataCheckpointData &checkpoint_data, AlpAnalyzeState<T> *analyze_state)
	    : CompressionState(analyze_state->info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ALP)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		//! Combinations found on the analyze step are needed for compression
		state.best_k_combinations = analyze_state->state.best_k_combinations;
	}